

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

_Bool arm_s1_regime_using_lpae_format_aarch64(CPUARMState_conflict *env,ARMMMUIdx mmu_idx)

{
  ulong uVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  TCR *pTVar5;
  
  if (mmu_idx == ARMMMUIdx_E10_0) {
    mmu_idx = ARMMMUIdx_Stage1_E0;
  }
  else if (mmu_idx == ARMMMUIdx_E10_1_PAN) {
    mmu_idx = ARMMMUIdx_Stage1_E1_PAN;
  }
  else if (mmu_idx == ARMMMUIdx_E10_1) {
    mmu_idx = ARMMMUIdx_Stage1_E1;
  }
  uVar2 = regime_el(env,mmu_idx);
  if (uVar2 == 2) {
    return true;
  }
  uVar1 = env->features;
  uVar4 = uVar1 & 0x10000000;
  if (uVar2 != 3) {
    uVar3 = 0;
    if ((uVar1 & 0x200000000) == 0) {
      uVar3 = ((uint)uVar1 & 0x10000000) >> 0x1c;
    }
    if ((~uVar1 & 0x210000000) == 0) {
      uVar3 = (uint)(env->cp15).scr_el3 >> 10;
    }
    uVar4 = (ulong)uVar3;
    if (((uVar1 >> 0x20 & 1) != 0) &&
       (((uVar1 & 0x200000000) == 0 || (((env->cp15).scr_el3 & 1) != 0)))) {
      if ((uVar3 & 1) == 0) goto LAB_00614c00;
      uVar4 = (env->cp15).hcr_el2 >> 0x1f;
    }
    uVar4 = uVar4 & 1;
  }
  if (uVar4 != 0) {
    return true;
  }
LAB_00614c00:
  if (((uint)uVar1 >> 0x1a & 1) != 0) {
    if (mmu_idx == ARMMMUIdx_Stage2) {
      pTVar5 = &(env->cp15).vtcr_el2;
    }
    else {
      uVar2 = regime_el(env,mmu_idx);
      pTVar5 = (env->cp15).tcr_el + uVar2;
    }
    if ((pTVar5->raw_tcr & 0x80000000) != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool arm_s1_regime_using_lpae_format(CPUARMState *env, ARMMMUIdx mmu_idx)
{
    mmu_idx = stage_1_mmu_idx(mmu_idx);

    return regime_using_lpae_format(env, mmu_idx);
}